

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

port_mapping_t __thiscall
libtorrent::upnp::add_mapping
          (upnp *this,portmap_protocol p,int external_port,endpoint *param_3,string *device)

{
  _Rb_tree_header *p_Var1;
  pointer pgVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  endpoint *ep;
  pointer pgVar10;
  pointer pgVar11;
  long lVar12;
  port_mapping_t i;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db_01;
  undefined1 local_78 [32];
  undefined8 local_58;
  _Alloc_hider _Stack_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  iVar7 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
  uVar13 = extraout_XMM0_Da;
  uVar14 = extraout_XMM0_Db;
  if ((char)iVar7 != '\0') {
    aux::print_endpoint_abi_cxx11_((string *)local_78,(aux *)param_3,ep);
    dVar3 = log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    uVar13 = SUB84(dVar3,0);
    uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      uVar13 = extraout_XMM0_Da_01;
      uVar14 = extraout_XMM0_Db_01;
    }
  }
  if (this->m_disabled != false) {
    return (port_mapping_t)-1;
  }
  pgVar11 = (this->m_mappings).
            super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
            .
            super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pgVar2 = (this->m_mappings).
           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
           .
           super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = ((long)pgVar2 - (long)pgVar11 >> 3) * -0x71c71c71c71c71c7;
  lVar12 = (long)uVar8 >> 2;
  pgVar10 = pgVar11;
  if (0 < lVar12) {
    pgVar10 = pgVar11 + lVar12 * 4;
    lVar12 = lVar12 + 1;
    pgVar11 = pgVar11 + 2;
    do {
      if (pgVar11[-2].protocol == none) {
        pgVar11 = pgVar11 + -2;
        goto LAB_0038fb56;
      }
      if (pgVar11[-1].protocol == none) {
        pgVar11 = pgVar11 + -1;
        goto LAB_0038fb56;
      }
      if (pgVar11->protocol == none) goto LAB_0038fb56;
      if (pgVar11[1].protocol == none) {
        pgVar11 = pgVar11 + 1;
        goto LAB_0038fb56;
      }
      lVar12 = lVar12 + -1;
      pgVar11 = pgVar11 + 4;
    } while (1 < lVar12);
  }
  lVar12 = ((long)pgVar2 - (long)pgVar10 >> 3) * -0x71c71c71c71c71c7;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      pgVar11 = pgVar2;
      if ((lVar12 != 3) || (pgVar11 = pgVar10, pgVar10->protocol == none)) goto LAB_0038fb56;
      pgVar10 = pgVar10 + 1;
    }
    pgVar11 = pgVar10;
    if (pgVar10->protocol == none) goto LAB_0038fb56;
    pgVar10 = pgVar10 + 1;
  }
  pgVar11 = pgVar10;
  if (pgVar10->protocol != none) {
    pgVar11 = pgVar2;
  }
LAB_0038fb56:
  if (pgVar11 == pgVar2) {
    if (0x31 < uVar8) {
      log(this,(double)CONCAT44(uVar14,uVar13));
      return (port_mapping_t)-1;
    }
    local_78._0_8_ = (pointer)0x0;
    local_58 = 0;
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    aStack_40._8_8_ = 0;
    local_78._8_8_ = 2;
    local_48 = 0;
    aStack_40._M_allocated_capacity = 0;
    _Stack_50._M_p = (pointer)&aStack_40;
    ::std::
    vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
    ::emplace_back<libtorrent::upnp::global_mapping_t>
              (&(this->m_mappings).
                super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
               ,(global_mapping_t *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_50._M_p != &aStack_40) {
      operator_delete(_Stack_50._M_p,aStack_40._M_allocated_capacity + 1);
    }
    pgVar11 = (this->m_mappings).
              super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
              .
              super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  pgVar11->protocol = p;
  pgVar11->external_port = external_port;
  uVar4 = *(undefined8 *)((long)&(param_3->impl_).data_ + 8);
  uVar5 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0xc);
  uVar6 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0x14);
  *(undefined8 *)&(pgVar11->local_ep).impl_.data_ = *(undefined8 *)&(param_3->impl_).data_;
  *(undefined8 *)((long)&(pgVar11->local_ep).impl_.data_ + 8) = uVar4;
  *(undefined8 *)((long)&(pgVar11->local_ep).impl_.data_ + 0xc) = uVar5;
  *(undefined8 *)((long)&(pgVar11->local_ep).impl_.data_ + 0x14) = uVar6;
  ::std::__cxx11::string::_M_assign((string *)&pgVar11->device);
  i.m_val = (int)((long)pgVar11 -
                  (long)(this->m_mappings).
                        super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                        .
                        super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x38e38e39;
  p_Var9 = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_devices)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      if (*(byte *)((long)&p_Var9[8]._M_color + 2) == 0) {
        if ((int)((ulong)((long)p_Var9[4]._M_parent - *(long *)(p_Var9 + 4)) >> 3) * -0x45d1745d <=
            i.m_val) {
          ::std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::
          resize((vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                  *)(p_Var9 + 4),(long)(i.m_val + 1));
        }
        lVar12 = *(long *)(p_Var9 + 4) + (long)i.m_val * 0x58;
        *(undefined1 *)(lVar12 + 8) = 1;
        *(portmap_protocol *)(lVar12 + 0x10) = p;
        *(int *)(lVar12 + 0xc) = external_port;
        uVar4 = *(undefined8 *)((long)&(param_3->impl_).data_ + 8);
        uVar5 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0xc);
        uVar6 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0x14);
        *(undefined8 *)(lVar12 + 0x14) = *(undefined8 *)&(param_3->impl_).data_;
        *(undefined8 *)(lVar12 + 0x1c) = uVar4;
        *(undefined8 *)(lVar12 + 0x20) = uVar5;
        *(undefined8 *)(lVar12 + 0x28) = uVar6;
        ::std::__cxx11::string::_M_assign((string *)(lVar12 + 0x30));
        if (p_Var9[3]._M_parent != (_Base_ptr)0x0) {
          update_map(this,(rootdevice *)(p_Var9 + 1),i);
        }
      }
      p_Var9 = (_Base_ptr)::std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  return (port_mapping_t)i.m_val;
}

Assistant:

port_mapping_t upnp::add_mapping(portmap_protocol const p, int const external_port
	, tcp::endpoint const local_ep, std::string const& device)
{
	TORRENT_ASSERT(is_single_thread());
	// external port 0 means _every_ port
	TORRENT_ASSERT(external_port != 0);

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("adding port map: [ protocol: %s ext_port: %d "
			"local_ep: %s device: %s] %s", (p == portmap_protocol::tcp?"tcp":"udp")
			, external_port
			, print_endpoint(local_ep).c_str(), device.c_str()
			, m_disabled ? "DISABLED": "");
	}
#endif
	if (m_disabled) return port_mapping_t{-1};

	auto mapping_it = std::find_if(m_mappings.begin(), m_mappings.end()
		, [](global_mapping_t const& m) { return m.protocol == portmap_protocol::none; });

	if (mapping_it == m_mappings.end())
	{
		TORRENT_ASSERT(m_mappings.size() <= max_global_mappings);
		if (m_mappings.size() >= max_global_mappings)
		{
#ifndef TORRENT_DISABLE_LOGGING
			log("too many mappings registered");
#endif
			return port_mapping_t{-1};
		}
		m_mappings.push_back(global_mapping_t());
		mapping_it = m_mappings.end() - 1;
	}

	mapping_it->protocol = p;
	mapping_it->external_port = external_port;
	mapping_it->local_ep = local_ep;
	mapping_it->device = device;

	port_mapping_t const mapping_index{static_cast<int>(mapping_it - m_mappings.begin())};

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;

		if (d.mapping.end_index() <= mapping_index)
			d.mapping.resize(static_cast<int>(mapping_index) + 1);
		mapping_t& m = d.mapping[mapping_index];

		m.act = portmap_action::add;
		m.protocol = p;
		m.external_port = external_port;
		m.local_ep = local_ep;
		m.device = device;

		if (!d.service_namespace.empty()) update_map(d, mapping_index);
	}

	return port_mapping_t{mapping_index};
}